

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall mpt::item_array<mpt::metatype>::compact(item_array<mpt::metatype> *this)

{
  iterator piVar1;
  metatype *pmVar2;
  content<mpt::item<mpt::metatype>_> *this_00;
  metatype *c;
  item<mpt::metatype> *to;
  item<mpt::metatype> *pos;
  long len;
  item<mpt::metatype> *space;
  item_array<mpt::metatype> *this_local;
  
  len = 0;
  pos = (item<mpt::metatype> *)0x0;
  to = unique_array<mpt::item<mpt::metatype>_>::begin
                 (&this->super_unique_array<mpt::item<mpt::metatype>_>);
  piVar1 = unique_array<mpt::item<mpt::metatype>_>::end
                     (&this->super_unique_array<mpt::item<mpt::metatype>_>);
  for (; to != piVar1; to = to + 1) {
    pmVar2 = reference<mpt::metatype>::instance(&to->super_reference<mpt::metatype>);
    if (pmVar2 == (metatype *)0x0) {
      if (len == 0) {
        len = (long)to;
      }
    }
    else {
      pos = (item<mpt::metatype> *)((long)&(pos->super_reference<mpt::metatype>)._ref + 1);
      if (len != 0) {
        item<mpt::metatype>::operator=((item<mpt::metatype> *)len,to);
        item<mpt::metatype>::~item(to);
        len = len + 0x20;
      }
    }
  }
  if (len != 0) {
    this_00 = reference<mpt::content<mpt::item<mpt::metatype>_>_>::instance
                        ((reference<mpt::content<mpt::item<mpt::metatype>_>_> *)this);
    content<mpt::item<mpt::metatype>_>::set_length(this_00,(long)pos);
  }
  return len != 0;
}

Assistant:

bool compact()
	{
		item<T> *space = 0;
		long len = 0;
		for (item<T> *pos = this->begin(), *to = this->end(); pos != to; ++pos) {
			T *c = pos->instance();
			if (!c) {
				if (!space) space = pos;
				continue;
			}
			++len;
			if (!space) continue;
#if __cplusplus >= 201103L
			*space = std::move(*pos);
#else
			space->operator = (static_cast<const identifier &>(*pos));
			space->set_instance(pos->detach());
#endif
			pos->~item<T>();
			++space;
		}
		if (!space) {
			return false;
		}
		this->_ref.instance()->set_length(len);
		return true;
	}